

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O0

void __thiscall Assimp::Discreet3DSImporter::ParseMeshChunk(Discreet3DSImporter *this)

{
  StreamReader<false,_false> *this_00;
  bool bVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  reference this_01;
  size_type __new_size;
  float fVar7;
  value_type_conflict4 local_6c;
  reference local_68;
  Face *sFace;
  uint local_4c;
  undefined1 local_48 [4];
  int num_2;
  aiVector3D v_1;
  int num_1;
  aiVector3D v;
  int num;
  Mesh *mMesh;
  uint oldReadLimit;
  int chunkSize;
  Discreet3DSImporter *pDStack_10;
  Chunk chunk;
  Discreet3DSImporter *this_local;
  
  pDStack_10 = this;
  do {
    do {
      uVar3 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
      if (uVar3 < 6) {
        return;
      }
      ReadChunk(this,(Chunk *)((long)&oldReadLimit + 2));
      iVar4 = chunkSize + -6;
    } while (iVar4 < 1);
    this_00 = this->stream;
    iVar5 = StreamReader<false,_false>::GetCurrentPos(this_00);
    uVar3 = StreamReader<false,_false>::SetReadLimit(this_00,iVar5 + iVar4);
    this_01 = std::vector<Assimp::D3DS::Mesh,_std::allocator<Assimp::D3DS::Mesh>_>::back
                        (&this->mScene->mMeshes);
    if (oldReadLimit._2_2_ == 0x4110) {
      uVar2 = StreamReader<false,_false>::GetI2(this->stream);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_01,
                 (long)(int)(uint)uVar2);
      v.y = (float)(uint)uVar2;
      while (0 < (int)v.y) {
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)&v_1.z);
        v_1.z = StreamReader<false,_false>::GetF4(this->stream);
        StreamReader<false,_false>::GetF4(this->stream);
        StreamReader<false,_false>::GetF4(this->stream);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_01,
                   (value_type *)&v_1.z);
        v.y = (float)((int)v.y + -1);
      }
    }
    else if (oldReadLimit._2_2_ == 0x4120) {
      uVar2 = StreamReader<false,_false>::GetI2(this->stream);
      local_4c = (uint)uVar2;
      std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>::reserve
                (&(this_01->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces,
                 (long)(int)local_4c);
      while (0 < (int)local_4c) {
        local_4c = local_4c - 1;
        memset((void *)((long)&sFace + 4),0,0x10);
        D3DS::Face::Face((Face *)((long)&sFace + 4));
        std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>::push_back
                  (&(this_01->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces,
                   (value_type *)((long)&sFace + 4));
        local_68 = std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>::back
                             (&(this_01->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces);
        uVar2 = StreamReader<false,_false>::GetI2(this->stream);
        (local_68->super_FaceWithSmoothingGroup).mIndices[0] = (uint)uVar2;
        uVar2 = StreamReader<false,_false>::GetI2(this->stream);
        (local_68->super_FaceWithSmoothingGroup).mIndices[1] = (uint)uVar2;
        uVar2 = StreamReader<false,_false>::GetI2(this->stream);
        (local_68->super_FaceWithSmoothingGroup).mIndices[2] = (uint)uVar2;
        StreamReader<false,_false>::IncPtr(this->stream,2);
      }
      local_4c = local_4c - 1;
      __new_size = std::vector<Assimp::D3DS::Face,_std::allocator<Assimp::D3DS::Face>_>::size
                             (&(this_01->super_MeshWithSmoothingGroups<Assimp::D3DS::Face>).mFaces);
      local_6c = 0xcdcdcdcd;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this_01->mFaceMaterials,__new_size,&local_6c);
      uVar6 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
      if (6 < (int)uVar6) {
        ParseFaceChunk(this);
      }
    }
    else if (oldReadLimit._2_2_ == 0x4140) {
      uVar2 = StreamReader<false,_false>::GetI2(this->stream);
      v_1.y = (float)(uint)uVar2;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                (&this_01->mTexCoords,(long)(int)v_1.y);
      while (fVar7 = (float)((int)v_1.y + -1), bVar1 = 0 < (int)v_1.y, v_1.y = fVar7, bVar1) {
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_48);
        local_48 = (undefined1  [4])StreamReader<false,_false>::GetF4(this->stream);
        num_2 = (int)StreamReader<false,_false>::GetF4(this->stream);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (&this_01->mTexCoords,(value_type *)local_48);
      }
    }
    else if (oldReadLimit._2_2_ == 0x4160) {
      fVar7 = StreamReader<false,_false>::GetF4(this->stream);
      (this_01->mMat).a1 = fVar7;
      fVar7 = StreamReader<false,_false>::GetF4(this->stream);
      (this_01->mMat).b1 = fVar7;
      fVar7 = StreamReader<false,_false>::GetF4(this->stream);
      (this_01->mMat).c1 = fVar7;
      fVar7 = StreamReader<false,_false>::GetF4(this->stream);
      (this_01->mMat).a2 = fVar7;
      fVar7 = StreamReader<false,_false>::GetF4(this->stream);
      (this_01->mMat).b2 = fVar7;
      fVar7 = StreamReader<false,_false>::GetF4(this->stream);
      (this_01->mMat).c2 = fVar7;
      fVar7 = StreamReader<false,_false>::GetF4(this->stream);
      (this_01->mMat).a3 = fVar7;
      fVar7 = StreamReader<false,_false>::GetF4(this->stream);
      (this_01->mMat).b3 = fVar7;
      fVar7 = StreamReader<false,_false>::GetF4(this->stream);
      (this_01->mMat).c3 = fVar7;
      fVar7 = StreamReader<false,_false>::GetF4(this->stream);
      (this_01->mMat).a4 = fVar7;
      fVar7 = StreamReader<false,_false>::GetF4(this->stream);
      (this_01->mMat).b4 = fVar7;
      fVar7 = StreamReader<false,_false>::GetF4(this->stream);
      (this_01->mMat).c4 = fVar7;
    }
    StreamReader<false,_false>::SkipToReadLimit(this->stream);
    StreamReader<false,_false>::SetReadLimit(this->stream,uVar3);
    uVar3 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
  } while (uVar3 != 0);
  return;
}

Assistant:

void Discreet3DSImporter::ParseMeshChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // Get the mesh we're currently working on
    D3DS::Mesh& mMesh = mScene->mMeshes.back();

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_VERTLIST:
        {
        // This is the list of all vertices in the current mesh
        int num = (int)(uint16_t)stream->GetI2();
        mMesh.mPositions.reserve(num);
        while (num-- > 0)   {
            aiVector3D v;
            v.x = stream->GetF4();
            v.y = stream->GetF4();
            v.z = stream->GetF4();
            mMesh.mPositions.push_back(v);
        }}
        break;
    case Discreet3DS::CHUNK_TRMATRIX:
        {
        // This is the RLEATIVE transformation matrix of the current mesh. Vertices are
        // pretransformed by this matrix wonder.
        mMesh.mMat.a1 = stream->GetF4();
        mMesh.mMat.b1 = stream->GetF4();
        mMesh.mMat.c1 = stream->GetF4();
        mMesh.mMat.a2 = stream->GetF4();
        mMesh.mMat.b2 = stream->GetF4();
        mMesh.mMat.c2 = stream->GetF4();
        mMesh.mMat.a3 = stream->GetF4();
        mMesh.mMat.b3 = stream->GetF4();
        mMesh.mMat.c3 = stream->GetF4();
        mMesh.mMat.a4 = stream->GetF4();
        mMesh.mMat.b4 = stream->GetF4();
        mMesh.mMat.c4 = stream->GetF4();
        }
        break;

    case Discreet3DS::CHUNK_MAPLIST:
        {
        // This is the list of all UV coords in the current mesh
        int num = (int)(uint16_t)stream->GetI2();
        mMesh.mTexCoords.reserve(num);
        while (num-- > 0)   {
            aiVector3D v;
            v.x = stream->GetF4();
            v.y = stream->GetF4();
            mMesh.mTexCoords.push_back(v);
        }}
        break;

    case Discreet3DS::CHUNK_FACELIST:
        {
        // This is the list of all faces in the current mesh
        int num = (int)(uint16_t)stream->GetI2();
        mMesh.mFaces.reserve(num);
        while (num-- > 0)   {
            // 3DS faces are ALWAYS triangles
            mMesh.mFaces.push_back(D3DS::Face());
            D3DS::Face& sFace = mMesh.mFaces.back();

            sFace.mIndices[0] = (uint16_t)stream->GetI2();
            sFace.mIndices[1] = (uint16_t)stream->GetI2();
            sFace.mIndices[2] = (uint16_t)stream->GetI2();

            stream->IncPtr(2); // skip edge visibility flag
        }

        // Resize the material array (0xcdcdcdcd marks the default material; so if a face is
        // not referenced by a material, $$DEFAULT will be assigned to it)
        mMesh.mFaceMaterials.resize(mMesh.mFaces.size(),0xcdcdcdcd);

        // Larger 3DS files could have multiple FACE chunks here
        chunkSize = stream->GetRemainingSizeToLimit();
        if ( chunkSize > (int) sizeof(Discreet3DS::Chunk ) )
            ParseFaceChunk();
        }
        break;
    };
    ASSIMP_3DS_END_CHUNK();
}